

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

htmlDocPtr htmlSAXParseDoc(xmlChar *cur,char *encoding,htmlSAXHandlerPtr sax,void *userData)

{
  int iVar1;
  htmlParserCtxtPtr ctxt;
  xmlParserInputPtr value;
  xmlDocPtr pxVar2;
  
  if ((cur != (xmlChar *)0x0) && (ctxt = htmlNewParserCtxt(), ctxt != (htmlParserCtxtPtr)0x0)) {
    pxVar2 = (xmlDocPtr)0x0;
    value = xmlCtxtNewInputFromString(ctxt,(char *)0x0,(char *)cur,encoding,0);
    if (value != (xmlParserInputPtr)0x0) {
      iVar1 = xmlCtxtPushInput(ctxt,value);
      if (iVar1 < 0) {
        xmlFreeInputStream(value);
        pxVar2 = (xmlDocPtr)0x0;
      }
      else {
        if (sax != (htmlSAXHandlerPtr)0x0) {
          memcpy(ctxt->sax,sax,0x100);
          ctxt->userData = userData;
        }
        htmlParseDocument(ctxt);
        pxVar2 = ctxt->myDoc;
      }
    }
    xmlFreeParserCtxt(ctxt);
    return pxVar2;
  }
  return (htmlDocPtr)0x0;
}

Assistant:

htmlDocPtr
htmlSAXParseDoc(const xmlChar *cur, const char *encoding,
                htmlSAXHandlerPtr sax, void *userData) {
    htmlDocPtr ret;
    htmlParserCtxtPtr ctxt;

    if (cur == NULL)
        return(NULL);

    ctxt = htmlCreateDocParserCtxt(cur, NULL, encoding);
    if (ctxt == NULL)
        return(NULL);

    if (sax != NULL) {
        *ctxt->sax = *sax;
        ctxt->userData = userData;
    }

    htmlParseDocument(ctxt);
    ret = ctxt->myDoc;
    htmlFreeParserCtxt(ctxt);

    return(ret);
}